

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdgif.c
# Opt level: O0

JDIMENSION load_interlaced_image(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  undefined8 *puVar1;
  int iVar2;
  JDIMENSION JVar3;
  undefined8 *puVar4;
  long in_RSI;
  long in_RDI;
  cd_progress_ptr progress;
  JDIMENSION row;
  JDIMENSION col;
  JSAMPROW sptr;
  gif_source_ptr source;
  gif_source_ptr in_stack_ffffffffffffffc8;
  uint local_28;
  int local_24;
  undefined1 *local_20;
  
  puVar1 = *(undefined8 **)(in_RDI + 0x10);
  for (local_28 = 0; local_28 < *(uint *)(in_RDI + 0x34); local_28 = local_28 + 1) {
    if (puVar1 != (undefined8 *)0x0) {
      puVar1[1] = (ulong)local_28;
      puVar1[2] = (ulong)*(uint *)(in_RDI + 0x34);
      (*(code *)*puVar1)(in_RDI);
    }
    puVar4 = (undefined8 *)
             (**(code **)(*(long *)(in_RDI + 8) + 0x38))
                       (in_RDI,*(undefined8 *)(in_RSI + 0x1a0),local_28,1);
    local_20 = (undefined1 *)*puVar4;
    for (local_24 = *(int *)(in_RDI + 0x30); local_24 != 0; local_24 = local_24 + -1) {
      iVar2 = LZWReadByte(in_stack_ffffffffffffffc8);
      *local_20 = (char)iVar2;
      local_20 = local_20 + 1;
    }
  }
  if (puVar1 != (undefined8 *)0x0) {
    *(int *)(puVar1 + 4) = *(int *)(puVar1 + 4) + 1;
  }
  *(code **)(in_RSI + 8) = get_interlaced_row;
  *(undefined4 *)(in_RSI + 0x1a8) = 0;
  *(uint *)(in_RSI + 0x1ac) = *(int *)(in_RDI + 0x34) + 7U >> 3;
  *(uint *)(in_RSI + 0x1b0) = *(int *)(in_RSI + 0x1ac) + (*(int *)(in_RDI + 0x34) + 3U >> 3);
  *(uint *)(in_RSI + 0x1b4) = *(int *)(in_RSI + 0x1b0) + (*(int *)(in_RDI + 0x34) + 1U >> 2);
  JVar3 = get_interlaced_row(_row,(cjpeg_source_ptr)progress);
  return JVar3;
}

Assistant:

METHODDEF(JDIMENSION)
load_interlaced_image(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
{
  gif_source_ptr source = (gif_source_ptr)sinfo;
  register JSAMPROW sptr;
  register JDIMENSION col;
  JDIMENSION row;
  cd_progress_ptr progress = (cd_progress_ptr)cinfo->progress;

  /* Read the interlaced image into the virtual array we've created. */
  for (row = 0; row < cinfo->image_height; row++) {
    if (progress != NULL) {
      progress->pub.pass_counter = (long)row;
      progress->pub.pass_limit = (long)cinfo->image_height;
      (*progress->pub.progress_monitor) ((j_common_ptr)cinfo);
    }
    sptr = *(*cinfo->mem->access_virt_sarray)
      ((j_common_ptr)cinfo, source->interlaced_image, row, (JDIMENSION)1,
       TRUE);
    for (col = cinfo->image_width; col > 0; col--) {
      *sptr++ = (JSAMPLE)LZWReadByte(source);
    }
  }
  if (progress != NULL)
    progress->completed_extra_passes++;

  /* Replace method pointer so subsequent calls don't come here. */
  source->pub.get_pixel_rows = get_interlaced_row;
  /* Initialize for get_interlaced_row, and perform first call on it. */
  source->cur_row_number = 0;
  source->pass2_offset = (cinfo->image_height + 7) / 8;
  source->pass3_offset = source->pass2_offset + (cinfo->image_height + 3) / 8;
  source->pass4_offset = source->pass3_offset + (cinfo->image_height + 1) / 4;

  return get_interlaced_row(cinfo, sinfo);
}